

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

Task * Imf_2_5::anon_unknown_6::newLineBufferTask
                 (TaskGroup *group,InputStreamMutex *streamData,Data *ifd,int number,int scanLineMin
                 ,int scanLineMax,OptimizationMode optimizationMode)

{
  LineBuffer *pLVar1;
  int *piVar2;
  uint in_ECX;
  long in_RDX;
  void *__stat_loc;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  Task *retTask;
  exception *e;
  LineBuffer *lineBuffer;
  int *in_stack_000004c0;
  char **in_stack_000004c8;
  int in_stack_000004d4;
  Data *in_stack_000004d8;
  InputStreamMutex *in_stack_000004e0;
  undefined8 in_stack_ffffffffffffff90;
  LineBuffer *in_stack_ffffffffffffff98;
  Data *in_stack_ffffffffffffffa0;
  TaskGroup *in_stack_ffffffffffffffa8;
  LineBufferTaskIIF *this;
  OptimizationMode in_stack_ffffffffffffffc0;
  int local_24;
  int local_20;
  uint local_1c;
  long local_18;
  
  __stat_loc = (void *)(ulong)in_ECX;
  local_1c = in_ECX;
  local_18 = in_RDX;
  pLVar1 = ScanLineInputFile::Data::getLineBuffer
                     (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  LineBuffer::wait(pLVar1,__stat_loc);
  if (pLVar1->maxY != local_1c) {
    *(uint *)((long)&pLVar1->dataPtr + 4) =
         *(int *)(local_18 + 0xa4) + local_1c * *(int *)(local_18 + 0x130);
    pLVar1->dataSize = *(int *)((long)&pLVar1->dataPtr + 4) + -1 + *(int *)(local_18 + 0x130);
    pLVar1->maxY = local_1c;
    (pLVar1->buffer)._size = 0;
    readPixelData(in_stack_000004e0,in_stack_000004d8,in_stack_000004d4,in_stack_000004c8,
                  in_stack_000004c0);
  }
  piVar2 = std::max<int>((int *)((long)&pLVar1->dataPtr + 4),&local_20);
  local_20 = *piVar2;
  piVar2 = std::min<int>(&pLVar1->dataSize,&local_24);
  local_24 = *piVar2;
  this = (LineBufferTaskIIF *)0x0;
  if ((in_stack_00000008 & 1) == 0) {
    pLVar1 = (LineBuffer *)operator_new(0x30);
    LineBufferTask::LineBufferTask
              ((LineBufferTask_conflict *)this,in_stack_ffffffffffffffa8,
               (Data *)CONCAT71(in_stack_00000009,in_stack_00000008),in_stack_ffffffffffffff98,
               (int)((ulong)pLVar1 >> 0x20),(int)pLVar1,in_stack_ffffffffffffffc0);
  }
  else {
    pLVar1 = (LineBuffer *)operator_new(0x30);
    LineBufferTaskIIF::LineBufferTaskIIF
              (this,(TaskGroup *)CONCAT71(in_stack_00000009,in_stack_00000008),
               in_stack_ffffffffffffffa0,pLVar1,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
               (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffffc0);
  }
  return (Task *)pLVar1;
}

Assistant:

Task *
newLineBufferTask (TaskGroup *group,
                   InputStreamMutex *streamData,
                   ScanLineInputFile::Data *ifd,
                   int number,
                   int scanLineMin,
                   int scanLineMax,
                   OptimizationMode optimizationMode)
{
     //
     // Wait for a line buffer to become available, fill the line
     // buffer with raw data from the file if necessary, and create
     // a new LineBufferTask whose execute() method will uncompress
     // the contents of the buffer and copy the pixels into the
     // frame buffer.
     //
     
     LineBuffer *lineBuffer = ifd->getLineBuffer (number);
     
     try
     {
         lineBuffer->wait ();
         
         if (lineBuffer->number != number)
         {
             lineBuffer->minY = ifd->minY + number * ifd->linesInBuffer;
             lineBuffer->maxY = lineBuffer->minY + ifd->linesInBuffer - 1;
             
             lineBuffer->number = number;
             lineBuffer->uncompressedData = 0;
             
             readPixelData (streamData, ifd, lineBuffer->minY,
                            lineBuffer->buffer,
                            lineBuffer->dataSize);
         }
     }
     catch (std::exception &e)
     {
         if (!lineBuffer->hasException)
         {
             lineBuffer->exception = e.what();
             lineBuffer->hasException = true;
         }
         lineBuffer->number = -1;
         lineBuffer->post();
         throw;
     }
     catch (...)
     {
         //
         // Reading from the file caused an exception.
         // Signal that the line buffer is free, and
         // re-throw the exception.
         //
         
         lineBuffer->exception = "unrecognized exception";
         lineBuffer->hasException = true;
         lineBuffer->number = -1;
         lineBuffer->post();
         throw;
     }
     
     scanLineMin = max (lineBuffer->minY, scanLineMin);
     scanLineMax = min (lineBuffer->maxY, scanLineMax);
     
     
     Task* retTask = 0;
     
#ifdef IMF_HAVE_SSE2     
     if (optimizationMode._optimizable)
     {
         
         retTask = new LineBufferTaskIIF (group, ifd, lineBuffer,
                                          scanLineMin, scanLineMax,
                                          optimizationMode);
      
     }
     else
#endif         
     {
         retTask = new LineBufferTask (group, ifd, lineBuffer,
                                       scanLineMin, scanLineMax,
                                       optimizationMode);
     }
     
     return retTask;
     
 }